

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_open16(void *zFilename,sqlite3 **ppDb)

{
  Schema *pSVar1;
  uint uVar2;
  int iVar3;
  sqlite3_value *v;
  byte bVar4;
  _func_void_void_ptr *in_R8;
  char *pcVar5;
  
  *ppDb = (sqlite3 *)0x0;
  uVar2 = sqlite3_initialize();
  if (uVar2 == 0) {
    pcVar5 = "";
    if (zFilename != (void *)0x0) {
      pcVar5 = (char *)zFilename;
    }
    v = sqlite3ValueNew((sqlite3 *)0x0);
    sqlite3ValueSetStr(v,(int)pcVar5,(void *)0x2,'\0',in_R8);
    pcVar5 = (char *)sqlite3ValueText(v,'\x01');
    if (pcVar5 == (char *)0x0) {
      bVar4 = 7;
    }
    else {
      iVar3 = openDatabase(pcVar5,ppDb,6,(char *)0x0);
      bVar4 = (byte)iVar3;
      if (iVar3 == 0) {
        pSVar1 = (*ppDb)->aDb->pSchema;
        if ((pSVar1->schemaFlags & 1) == 0) {
          (*ppDb)->enc = '\x02';
          pSVar1->enc = '\x02';
        }
        bVar4 = 0;
      }
    }
    sqlite3ValueFree(v);
    uVar2 = (uint)bVar4;
  }
  return uVar2;
}

Assistant:

SQLITE_API int sqlite3_open16(
  const void *zFilename,
  sqlite3 **ppDb
){
  char const *zFilename8;   /* zFilename encoded in UTF-8 instead of UTF-16 */
  sqlite3_value *pVal;
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppDb==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppDb = 0;
#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
  if( zFilename==0 ) zFilename = "\000\000";
  pVal = sqlite3ValueNew(0);
  sqlite3ValueSetStr(pVal, -1, zFilename, SQLITE_UTF16NATIVE, SQLITE_STATIC);
  zFilename8 = sqlite3ValueText(pVal, SQLITE_UTF8);
  if( zFilename8 ){
    rc = openDatabase(zFilename8, ppDb,
                      SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE, 0);
    assert( *ppDb || rc==SQLITE_NOMEM );
    if( rc==SQLITE_OK && !DbHasProperty(*ppDb, 0, DB_SchemaLoaded) ){
      SCHEMA_ENC(*ppDb) = ENC(*ppDb) = SQLITE_UTF16NATIVE;
    }
  }else{
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3ValueFree(pVal);

  return rc & 0xff;
}